

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::sse2::BVH4InstanceSceneBuilderSAH(void *bvh,Scene *scene,GTypeMask gtype)

{
  BVHNBuilderSAH<4,_embree::InstancePrimitive> *this;
  
  this = (BVHNBuilderSAH<4,_embree::InstancePrimitive> *)::operator_new(0xa8);
  BVHNBuilderSAH<4,_embree::InstancePrimitive>::BVHNBuilderSAH
            (this,(BVH *)bvh,scene,4,1.0,1,1,gtype,false);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4InstanceSceneBuilderSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype) {
      return new BVHNBuilderSAH<4,InstancePrimitive>((BVH4*)bvh,scene,4,1.0f,1,1,gtype);
    }